

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

Vec4 __thiscall glcts::SetLumSat(glcts *this,Vec4 *cbase,Vec4 *csat,Vec4 *clum)

{
  uint uVar1;
  float s;
  float s_00;
  float fVar2;
  Vec4 VVar3;
  Vec4 color;
  Vector<float,_4> local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  tcu local_48 [16];
  tcu local_38 [16];
  
  local_88 = ZEXT416((uint)cbase->m_data[0]);
  local_98 = ZEXT416((uint)cbase->m_data[1]);
  local_78 = ZEXT416((uint)cbase->m_data[2]);
  s = Saturation(cbase);
  s_00 = Saturation(csat);
  tcu::Vector<float,_4>::Vector(&local_a8);
  if (s <= 0.0) {
    tcu::Vector<float,_4>::Vector(&local_68,0.0);
  }
  else {
    fVar2 = (float)(~-(uint)((float)local_88._0_4_ <= (float)local_98._0_4_) & local_98._0_4_ |
                   local_88._0_4_ & -(uint)((float)local_88._0_4_ <= (float)local_98._0_4_));
    uVar1 = -(uint)(fVar2 <= (float)local_78._0_4_);
    tcu::Vector<float,_4>::Vector(&local_58,(float)(~uVar1 & local_78._0_4_ | uVar1 & (uint)fVar2));
    tcu::operator-(local_48,cbase,&local_58);
    tcu::operator*(local_38,s_00,(Vector<float,_4> *)local_48);
    tcu::operator/((tcu *)&local_68,(Vector<float,_4> *)local_38,s);
  }
  VVar3 = SetLum(this,&local_a8,clum);
  return (Vec4)VVar3.m_data;
}

Assistant:

static tcu::Vec4 SetLumSat(const tcu::Vec4& cbase, const tcu::Vec4& csat, const tcu::Vec4& clum)
{
	float	 minbase = MinRGB(cbase);
	float	 sbase   = Saturation(cbase);
	float	 ssat	= Saturation(csat);
	tcu::Vec4 color;
	if (sbase > 0)
	{
		// From the extension spec:
		// Equivalent (modulo rounding errors) to setting the
		// smallest (R,G,B) component to 0, the largest to <ssat>,
		// and interpolating the "middle" component based on its
		// original value relative to the smallest/largest.
		color = (cbase - tcu::Vec4(minbase)) * ssat / sbase;
	}
	else
	{
		color = tcu::Vec4(0.0f);
	}
	return SetLum(color, clum);
}